

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall
ON_ClassArray<ON_HatchLine>::Append(ON_ClassArray<ON_HatchLine> *this,int count,ON_HatchLine *p)

{
  int iVar1;
  int local_28;
  int local_24;
  int newcapacity;
  int i;
  ON_HatchLine *p_local;
  int count_local;
  ON_ClassArray<ON_HatchLine> *this_local;
  
  if ((0 < count) && (p != (ON_HatchLine *)0x0)) {
    if (this->m_capacity < count + this->m_count) {
      local_28 = NewCapacity(this);
      if (local_28 < count + this->m_count) {
        local_28 = count + this->m_count;
      }
      Reserve(this,(long)local_28);
    }
    for (local_24 = 0; local_24 < count; local_24 = local_24 + 1) {
      iVar1 = this->m_count;
      this->m_count = iVar1 + 1;
      ON_HatchLine::operator=(this->m_a + iVar1,p + local_24);
    }
  }
  return;
}

Assistant:

void ON_ClassArray<T>::Append( int count, const T* p ) 
{
  int i;
  if ( count > 0 && p ) 
  {
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      Reserve( newcapacity );
    }
    for ( i = 0; i < count; i++ ) {
      m_a[m_count++] = p[i];
    }
  }
}